

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

bool P_LookForTID(AActor *actor,INTBOOL allaround,FLookExParams *params)

{
  TObjPtr<AActor> *pTVar1;
  TObjPtr<AActor> *obj;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  AActor *pAVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  byte bVar8;
  int iVar9;
  FActorIterator iterator;
  FActorIterator local_40;
  
  if (params == (FLookExParams *)0x0) {
    bVar8 = 0;
  }
  else {
    bVar8 = ((byte)params->flags & 4) >> 2;
  }
  pAVar5 = P_BlockmapSearch(actor,0,LookForTIDInBlock,params);
  if (pAVar5 != (AActor *)0x0) {
    pAVar6 = GC::ReadBarrier<AActor>((AActor **)&actor->goal);
    if (pAVar6 != (AActor *)0x0) {
      pAVar6 = GC::ReadBarrier<AActor>((AActor **)&actor->goal);
      pAVar7 = GC::ReadBarrier<AActor>((AActor **)&actor->target);
      if (pAVar7 == pAVar6) {
        actor->reactiontime = 0;
      }
    }
    (actor->target).field_0.p = pAVar5;
    (actor->LastLookActor).field_0.p = pAVar5;
    return true;
  }
  pTVar1 = &actor->LastLookActor;
  pAVar5 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
  if (pAVar5 == (AActor *)0x0) {
    local_40.id = actor->TIDtoHate;
  }
  else {
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
    iVar9 = actor->TIDtoHate;
    local_40.id = pAVar5->tid;
    if (pAVar5->tid != iVar9) {
      (pTVar1->field_0).p = (AActor *)0x0;
      local_40.id = iVar9;
    }
  }
  local_40.base = GC::ReadBarrier<AActor>((AActor **)pTVar1);
  uVar4 = FRandom::operator()(&pr_look3);
  iVar9 = (uVar4 & 0x1f) + 7;
  bVar3 = false;
  do {
    while( true ) {
      pAVar5 = FActorIterator::Next(&local_40);
      pAVar6 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
      if (pAVar5 == pAVar6) goto LAB_003fcbc9;
      if (pAVar5 == (AActor *)0x0) break;
      if ((((pAVar5 != actor) && (((pAVar5->flags).Value & 4) != 0)) && (0 < pAVar5->health)) &&
         (((pAVar5->flags2).Value & 0x10000000) == 0)) {
        iVar9 = iVar9 + -1;
        if (iVar9 == 0) goto LAB_003fcbc9;
        if ((((actor->flags3).Value & 0x80) != 0) ||
           (bVar2 = P_IsVisible(actor,pAVar5,(uint)(allaround != 0),params), bVar2)) {
          pAVar6 = GC::ReadBarrier<AActor>((AActor **)&actor->goal);
          if (pAVar6 != (AActor *)0x0) {
            pAVar6 = GC::ReadBarrier<AActor>((AActor **)&actor->goal);
            pAVar7 = GC::ReadBarrier<AActor>((AActor **)&actor->target);
            if (pAVar7 == pAVar6) {
              actor->reactiontime = 0;
            }
          }
          (actor->target).field_0.p = pAVar5;
          (actor->LastLookActor).field_0.p = pAVar5;
          return true;
        }
      }
    }
    bVar2 = !bVar3;
    bVar3 = true;
  } while (bVar2);
LAB_003fcbc9:
  (actor->LastLookActor).field_0.p = pAVar5;
  pTVar1 = &actor->target;
  pAVar5 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
  if (pAVar5 == (AActor *)0x0) {
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)&actor->goal);
    if (pAVar5 != (AActor *)0x0 && bVar8 == 0) {
      pTVar1->field_0 = (actor->goal).field_0;
      return true;
    }
    obj = &actor->lastenemy;
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
    if ((pAVar5 != (AActor *)0x0) &&
       (pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj), 0 < pAVar5->health)) {
      pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
      bVar3 = AActor::IsFriend(actor,pAVar5);
      if (!bVar3) {
        (pTVar1->field_0).p = (AActor *)*(AActor **)&obj->field_0;
        (obj->field_0).p = (AActor *)0x0;
        return true;
      }
      (obj->field_0).p = (AActor *)0x0;
    }
  }
  return false;
}

Assistant:

bool P_LookForTID (AActor *actor, INTBOOL allaround, FLookExParams *params)
{
	AActor *other;
	bool reachedend = false;
	bool chasegoal = params? (!(params->flags & LOF_DONTCHASEGOAL)) : true;

	other = P_BlockmapSearch (actor, 0, LookForTIDInBlock, params);

	if (other != NULL)
	{
		if (actor->goal && actor->target == actor->goal)
			actor->reactiontime = 0;

		actor->target = other;
		actor->LastLookActor = other;
		return true;
	}

	// The actor's TID could change because of death or because of
	// Thing_ChangeTID. If it's not what we expect, then don't use
	// it as a base for the iterator.
	if (actor->LastLookActor != NULL &&
		actor->LastLookActor->tid != actor->TIDtoHate)
	{
		actor->LastLookActor = NULL;
	}

	FActorIterator iterator (actor->TIDtoHate, actor->LastLookActor);
	int c = (pr_look3() & 31) + 7;	// Look for between 7 and 38 hatees at a time
	while ((other = iterator.Next()) != actor->LastLookActor)
	{
		if (other == NULL)
		{
			if (reachedend)
			{
				// we have cycled through the entire list at least once
				// so let's abort because even if we continue nothing can
				// be found.
				break;
			}
			reachedend = true;
			continue;
		}

		if (!(other->flags & MF_SHOOTABLE))
			continue;			// not shootable (observer or dead)

		if (other == actor)
			continue;			// don't hate self

		if (other->health <= 0)
			continue;			// dead

		if (other->flags2 & MF2_DORMANT)
			continue;			// don't target dormant things

		if (--c == 0)
			break;

		if (!(actor->flags3 & MF3_NOSIGHTCHECK))
		{
			if (!P_IsVisible (actor, other, !!allaround, params))
				continue;			// out of sight
		}
		
		// [RH] Need to be sure the reactiontime is 0 if the monster is
		//		leaving its goal to go after something else.
		if (actor->goal && actor->target == actor->goal)
			actor->reactiontime = 0;

		actor->target = other;
		actor->LastLookActor = other;
		return true;
	}
	actor->LastLookActor = other;
	if (actor->target == NULL)
	{
		// [RH] use goal as target
		if (actor->goal != NULL && chasegoal)
		{
			actor->target = actor->goal;
			return true;
		}
		// Use last known enemy if no hatee sighted -- killough 2/15/98:
		if (actor->lastenemy != NULL && actor->lastenemy->health > 0)
		{
			if (!actor->IsFriend(actor->lastenemy))
			{
				actor->target = actor->lastenemy;
				actor->lastenemy = NULL;
				return true;
			}
			else
			{
				actor->lastenemy = NULL;
			}
		}
	}
	return false;
}